

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O0

string * __thiscall
duckdb::Linenoise::AddContinuationMarkers_abi_cxx11_
          (Linenoise *this,char *buf,size_t len,int plen,int cursor_row,
          vector<duckdb::highlightToken,_true> *tokens)

{
  size_type sVar1;
  reference pvVar2;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  int in_R8D;
  int in_R9D;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_00000008;
  highlightToken token;
  tokenType prev_type;
  size_t continuationBytes;
  int i;
  size_t continuationRender;
  size_t continuationLen;
  char *prompt;
  bool is_cursor_row;
  bool is_newline;
  vector<duckdb::highlightToken,_true> new_tokens;
  size_t token_position;
  size_t extra_bytes;
  size_t prev_pos;
  size_t cpos;
  int cols;
  int rows;
  string *result;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<duckdb::highlightToken,_true> *in_stack_fffffffffffffe90;
  value_type *in_stack_fffffffffffffe98;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *in_stack_fffffffffffffea0
  ;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *pvVar3;
  size_t *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  ulong uVar4;
  highlightToken *in_stack_fffffffffffffeb8;
  Linenoise *in_stack_fffffffffffffec0;
  reference in_stack_fffffffffffffed0;
  char *local_f8;
  highlightToken local_c8;
  tokenType local_a9;
  long local_a8;
  int local_9c;
  size_t local_98;
  size_t local_90;
  char *local_88;
  tokenType local_7e;
  byte local_7d;
  ulong local_58;
  vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *local_50;
  ulong local_48;
  ulong local_40;
  int local_34;
  int local_30;
  byte local_29;
  int local_28;
  int local_24;
  ulong local_20;
  long local_18;
  
  local_29 = 0;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  ::std::__cxx11::string::string((string *)in_RDI);
  local_30 = 1;
  local_34 = local_24;
  local_40 = 0;
  local_48 = 0;
  local_50 = (vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)0x0;
  local_58 = 0;
  vector<duckdb::highlightToken,_true>::vector((vector<duckdb::highlightToken,_true> *)0x20228d);
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
            (in_stack_00000008);
  ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::reserve
            ((vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
             in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
  while (local_40 < local_20) {
    local_7d = IsNewline(*(char *)(local_18 + local_40));
    in_stack_fffffffffffffe88 = local_24;
    NextPosition(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
                 (size_t)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                 (int *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98,
                 (int)in_stack_fffffffffffffed0);
    for (; local_48 < local_40; local_48 = local_48 + 1) {
      ::std::__cxx11::string::operator+=((string *)in_RDI,*(char *)(local_18 + local_48));
    }
    if ((local_7d & 1) != 0) {
      local_7e = local_30 == local_28;
      if ((bool)local_7e) {
        local_f8 = continuationSelectedPrompt;
      }
      else {
        local_f8 = continuationPrompt;
      }
      local_88 = local_f8;
      if ((*(byte *)(in_RSI + 0x61) & 1) == 0) {
        local_88 = anon_var_dwarf_3eb64fd + 9;
      }
      local_90 = strlen(local_88);
      local_98 = ComputeRenderWidth(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
      for (local_9c = (int)local_98; local_9c < local_24; local_9c = local_9c + 1) {
        ::std::__cxx11::string::operator+=((string *)in_RDI," ");
      }
      ::std::__cxx11::string::operator+=((string *)in_RDI,local_88);
      uVar4 = local_58;
      local_a8 = ((long)local_24 - local_98) + local_90;
      sVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                        (in_stack_00000008);
      if (uVar4 < sVar1) {
        while ((uVar4 = local_58,
               sVar1 = ::std::
                       vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                                 (in_stack_00000008), uVar4 < sVar1 &&
               (pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                                   (in_stack_fffffffffffffe90,
                                    CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)),
               pvVar3 = local_50, pvVar2->start < local_40))) {
          pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                             (in_stack_fffffffffffffe90,
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          pvVar2->start =
               (long)&(pvVar3->
                      super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      )._M_impl.super__Vector_impl_data._M_start + pvVar2->start;
          in_stack_fffffffffffffed0 =
               vector<duckdb::highlightToken,_true>::operator[]
                         (in_stack_fffffffffffffe90,
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          local_58 = local_58 + 1;
        }
        uVar4 = local_58;
        local_a9 = TOKEN_IDENTIFIER;
        if ((local_58 != 0) &&
           (sVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
                    size(in_stack_00000008), uVar4 < sVar1 + 1)) {
          in_stack_fffffffffffffec0 =
               (Linenoise *)
               vector<duckdb::highlightToken,_true>::operator[]
                         (in_stack_fffffffffffffe90,
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          local_a9 = *(tokenType *)&in_stack_fffffffffffffec0->ifd;
        }
        in_stack_fffffffffffffeb8 = &local_c8;
        highlightToken::highlightToken(in_stack_fffffffffffffeb8);
        local_c8.start =
             (long)&(local_50->
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    )._M_impl.super__Vector_impl_data._M_start + local_40;
        local_c8.type = local_7e & TOKEN_NUMERIC_CONSTANT | TOKEN_CONTINUATION;
        local_c8.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        local_c8.start =
             (long)&(local_50->
                    super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                    )._M_impl.super__Vector_impl_data._M_start + local_a8 + local_40;
        local_c8.type = local_a9;
        local_c8.search_match = false;
        ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      local_50 = (vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_> *)
                 ((long)&(local_50->
                         super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_a8);
    }
  }
  for (; local_48 < local_40; local_48 = local_48 + 1) {
    ::std::__cxx11::string::operator+=((string *)in_RDI,*(char *)(local_18 + local_48));
  }
  while (uVar4 = local_58,
        sVar1 = ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::size
                          (in_stack_00000008), uVar4 < sVar1) {
    pvVar3 = local_50;
    pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                       (in_stack_fffffffffffffe90,
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    pvVar2->start =
         (long)&(pvVar3->
                super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>)
                ._M_impl.super__Vector_impl_data._M_start + pvVar2->start;
    pvVar2 = vector<duckdb::highlightToken,_true>::operator[]
                       (in_stack_fffffffffffffe90,
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::push_back
              (pvVar3,pvVar2);
    local_58 = local_58 + 1;
  }
  vector<duckdb::highlightToken,_true>::operator=
            (in_stack_fffffffffffffe90,
             (vector<duckdb::highlightToken,_true> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_29 = 1;
  vector<duckdb::highlightToken,_true>::~vector((vector<duckdb::highlightToken,_true> *)0x202875);
  if ((local_29 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

string Linenoise::AddContinuationMarkers(const char *buf, size_t len, int plen, int cursor_row,
                                         vector<highlightToken> &tokens) const {
	std::string result;
	int rows = 1;
	int cols = plen;
	size_t cpos = 0;
	size_t prev_pos = 0;
	size_t extra_bytes = 0;    // extra bytes introduced
	size_t token_position = 0; // token position
	vector<highlightToken> new_tokens;
	new_tokens.reserve(tokens.size());
	while (cpos < len) {
		bool is_newline = IsNewline(buf[cpos]);
		NextPosition(buf, len, cpos, rows, cols, plen);
		for (; prev_pos < cpos; prev_pos++) {
			result += buf[prev_pos];
		}
		if (is_newline) {
			bool is_cursor_row = rows == cursor_row;
			const char *prompt = is_cursor_row ? continuationSelectedPrompt : continuationPrompt;
			if (!continuation_markers) {
				prompt = "";
			}
			size_t continuationLen = strlen(prompt);
			size_t continuationRender = ComputeRenderWidth(prompt, continuationLen);
			// pad with spaces prior to prompt
			for (int i = int(continuationRender); i < plen; i++) {
				result += " ";
			}
			result += prompt;
			size_t continuationBytes = plen - continuationRender + continuationLen;
			if (token_position < tokens.size()) {
				for (; token_position < tokens.size(); token_position++) {
					if (tokens[token_position].start >= cpos) {
						// not there yet
						break;
					}
					tokens[token_position].start += extra_bytes;
					new_tokens.push_back(tokens[token_position]);
				}
				tokenType prev_type = tokenType::TOKEN_IDENTIFIER;
				if (token_position > 0 && token_position < tokens.size() + 1) {
					prev_type = tokens[token_position - 1].type;
				}
				highlightToken token;
				token.start = cpos + extra_bytes;
				token.type = is_cursor_row ? tokenType::TOKEN_CONTINUATION_SELECTED : tokenType::TOKEN_CONTINUATION;
				token.search_match = false;
				new_tokens.push_back(token);

				token.start = cpos + extra_bytes + continuationBytes;
				token.type = prev_type;
				token.search_match = false;
				new_tokens.push_back(token);
			}
			extra_bytes += continuationBytes;
		}
	}
	for (; prev_pos < cpos; prev_pos++) {
		result += buf[prev_pos];
	}
	for (; token_position < tokens.size(); token_position++) {
		tokens[token_position].start += extra_bytes;
		new_tokens.push_back(tokens[token_position]);
	}
	tokens = std::move(new_tokens);
	return result;
}